

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONScanner.cpp
# Opt level: O1

tokens __thiscall JSON::JSONScanner::ScanString(JSONScanner *this)

{
  char16 *pcVar1;
  Type *pTVar2;
  uint *puVar3;
  char16 cVar4;
  char16 cVar5;
  int iVar6;
  char16 *pcVar7;
  Type pRVar8;
  code *pcVar9;
  int iVar10;
  int iVar11;
  bool bVar12;
  BOOL BVar13;
  undefined4 *puVar14;
  RangeCharacterPairList *pRVar15;
  char16 *pcVar16;
  bool bVar17;
  uint uVar18;
  char16 *pcVar19;
  uint uVar20;
  int local_34 [2];
  int tempHex;
  
  this->currentIndex = 0;
  pcVar19 = this->currentChar;
  this->currentString = pcVar19;
  uVar20 = 0;
  bVar12 = true;
  puVar14 = (undefined4 *)__tls_get_addr();
  bVar17 = false;
  do {
    pcVar7 = this->currentChar;
    pcVar16 = this->inputText + this->inputLen;
    if (pcVar16 <= pcVar7) break;
    pcVar1 = pcVar7 + 1;
    this->currentChar = pcVar1;
    cVar4 = *pcVar7;
    if (cVar4 == L'\"') {
      bVar17 = true;
    }
    else {
      if ((ushort)cVar4 < 0x20) goto switchD_00b72595_caseD_6f;
      if (cVar4 == L'\\') {
        if (pcVar16 <= pcVar1) goto LAB_00b7283d;
        this->currentChar = pcVar7 + 2;
        cVar5 = pcVar7[1];
        if ((ushort)cVar5 < 0x62) {
          if ((ushort)cVar5 < 0x2f) {
            uVar18 = (uint)(ushort)cVar5;
            if (cVar5 != L'\"') {
              if (cVar5 != L'\0') goto switchD_00b72595_caseD_6f;
              this->currentChar = pcVar1;
              goto LAB_00b7283d;
            }
          }
          else {
            uVar18 = (uint)(ushort)cVar5;
            if ((cVar5 != L'/') && (uVar18 = (uint)(ushort)cVar5, cVar5 != L'\\')) {
switchD_00b72595_caseD_6f:
              ThrowSyntaxError(this,-0x7ff5e9e9);
            }
          }
        }
        else {
          switch(cVar5) {
          case L'n':
            uVar18 = 10;
            break;
          case L'o':
          case L'p':
          case L'q':
          case L's':
            goto switchD_00b72595_caseD_6f;
          case L'r':
            uVar18 = 0xd;
            break;
          case L't':
            uVar18 = 9;
            break;
          case L'u':
            if (pcVar16 <= pcVar7 + 5) goto LAB_00b7283d;
            this->currentChar = pcVar7 + 3;
            BVar13 = Js::NumberUtilities::FHexDigit(pcVar7[2],local_34);
            iVar6 = local_34[0];
            if (BVar13 == 0) {
LAB_00b72828:
              ThrowSyntaxError(this,-0x7ff5e9e8);
            }
            pcVar7 = this->currentChar;
            this->currentChar = pcVar7 + 1;
            BVar13 = Js::NumberUtilities::FHexDigit(*pcVar7,local_34);
            iVar10 = local_34[0];
            if (BVar13 == 0) goto LAB_00b72828;
            pcVar7 = this->currentChar;
            this->currentChar = pcVar7 + 1;
            BVar13 = Js::NumberUtilities::FHexDigit(*pcVar7,local_34);
            iVar11 = local_34[0];
            if (BVar13 == 0) goto LAB_00b72828;
            pcVar7 = this->currentChar;
            this->currentChar = pcVar7 + 1;
            BVar13 = Js::NumberUtilities::FHexDigit(*pcVar7,local_34);
            if (BVar13 == 0) goto LAB_00b72828;
            uVar18 = iVar11 * 0x10 + iVar10 * 0x100 + iVar6 * 0x1000 + local_34[0];
            if (0xffff < uVar18) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar14 = 1;
              bVar12 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JSONScanner.cpp"
                                  ,0x14a,"(chcode == (chcode & 0xFFFF))","Bad unicode code");
              if (!bVar12) {
                pcVar9 = (code *)invalidInstructionException();
                (*pcVar9)();
              }
              *puVar14 = 0;
            }
            break;
          default:
            if (cVar5 == L'b') {
              uVar18 = 8;
            }
            else {
              if (cVar5 != L'f') goto switchD_00b72595_caseD_6f;
              uVar18 = 0xc;
            }
          }
        }
        pRVar15 = GetCurrentRangeCharacterPairList(this);
        pcVar7 = this->inputText;
        JsUtil::
        List<JSON::JSONScanner::RangeCharacterPair,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        ::EnsureArray(pRVar15,0);
        pRVar8 = (pRVar15->
                 super_ReadOnlyList<JSON::JSONScanner::RangeCharacterPair,_Memory::ArenaAllocator,_DefaultComparer>
                 ).buffer;
        iVar6 = (pRVar15->
                super_ReadOnlyList<JSON::JSONScanner::RangeCharacterPair,_Memory::ArenaAllocator,_DefaultComparer>
                ).count;
        pRVar8[iVar6].m_rangeStart = (uint)((ulong)((long)pcVar19 - (long)pcVar7) >> 1);
        pRVar8[iVar6].m_rangeLength = uVar20;
        pRVar8[iVar6].m_char = (char16)uVar18;
        pTVar2 = &(pRVar15->
                  super_ReadOnlyList<JSON::JSONScanner::RangeCharacterPair,_Memory::ArenaAllocator,_DefaultComparer>
                  ).count;
        *pTVar2 = *pTVar2 + 1;
        puVar3 = &this->currentIndex;
        uVar18 = *puVar3;
        *puVar3 = *puVar3 + uVar20 + 1;
        if (CARRY4(uVar18,uVar20 + 1)) goto LAB_00b72823;
        pcVar19 = this->currentChar;
        bVar12 = false;
        uVar20 = 0;
      }
      else {
        uVar20 = uVar20 + 1;
      }
    }
  } while (cVar4 != L'\"');
  if (bVar17) {
    if (bVar12) {
      this->currentIndex = uVar20;
      Output::TraceWithFlush
                (JSONPhase,L"ScanString(): direct-mapped string as \'%.*s\'\n",(ulong)uVar20,
                 this->currentString);
    }
    else {
      if (uVar20 != 0) {
        pRVar15 = GetCurrentRangeCharacterPairList(this);
        pcVar7 = this->inputText;
        JsUtil::
        List<JSON::JSONScanner::RangeCharacterPair,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        ::EnsureArray(pRVar15,0);
        pRVar8 = (pRVar15->
                 super_ReadOnlyList<JSON::JSONScanner::RangeCharacterPair,_Memory::ArenaAllocator,_DefaultComparer>
                 ).buffer;
        iVar6 = (pRVar15->
                super_ReadOnlyList<JSON::JSONScanner::RangeCharacterPair,_Memory::ArenaAllocator,_DefaultComparer>
                ).count;
        pRVar8[iVar6].m_rangeStart = (uint)((ulong)((long)pcVar19 - (long)pcVar7) >> 1);
        pRVar8[iVar6].m_rangeLength = uVar20;
        pRVar8[iVar6].m_char = L'\0';
        pTVar2 = &(pRVar15->
                  super_ReadOnlyList<JSON::JSONScanner::RangeCharacterPair,_Memory::ArenaAllocator,_DefaultComparer>
                  ).count;
        *pTVar2 = *pTVar2 + 1;
        puVar3 = &this->currentIndex;
        uVar18 = *puVar3;
        *puVar3 = *puVar3 + uVar20;
        if (CARRY4(uVar18,uVar20)) {
LAB_00b72823:
          Js::Throw::OutOfMemory();
        }
      }
      BuildUnescapedString(this,uVar20 != 0);
      pRVar15 = GetCurrentRangeCharacterPairList(this);
      (pRVar15->
      super_ReadOnlyList<JSON::JSONScanner::RangeCharacterPair,_Memory::ArenaAllocator,_DefaultComparer>
      ).count = 0;
      this->currentString = this->stringBuffer;
    }
    this->pToken->tk = tkStrCon;
    return tkStrCon;
  }
LAB_00b7283d:
  ThrowSyntaxError(this,-0x7ff5e9e7);
}

Assistant:

tokens JSONScanner::ScanString()
    {
        char16 ch;

        this->currentIndex = 0;
        this->currentString = const_cast<char16*>(currentChar);
        bool endFound = false;
        bool isStringDirectInputTextMapped = true;
        LPCWSTR bulkStart = currentChar;
        uint bulkLength = 0;

        while (currentChar < inputText + inputLen)
        {
            ch = ReadNextChar();
            int tempHex;

            if (ch == '"')
            {
                //end of the string
                endFound = true;
                break;
            }
            else if (ch <= 0x1F)
            {
                //JSON doesn't accept \u0000 - \u001f range, LS(\u2028) and PS(\u2029) are ok
               ThrowSyntaxError(JSERR_JsonIllegalChar);
            }
            else if ( 0 == ch )
            {
                currentChar--;
               ThrowSyntaxError(JSERR_JsonNoStrEnd);
            }
            else if ('\\' == ch)
            {
                //JSON escape sequence in a string \", \/, \\, \b, \f, \n, \r, \t, unicode seq
                // unlikely V5.8 regular chars are not escaped, i.e '\g'' in a string is illegal not 'g'
                if (currentChar >= inputText + inputLen )
                {
                   ThrowSyntaxError(JSERR_JsonNoStrEnd);
                }

                ch = ReadNextChar();
                switch (ch)
                {
                case 0:
                    currentChar--;
                   ThrowSyntaxError(JSERR_JsonNoStrEnd);

                case '"':
                case '/':
                case '\\':
                    //keep ch
                    break;

                case 'b':
                    ch = 0x08;
                    break;

                case 'f':
                    ch = 0x0C;
                    break;

                case 'n':
                    ch = 0x0A;
                    break;

                case 'r':
                    ch = 0x0D;
                    break;

                case 't':
                    ch = 0x09;
                    break;

                case 'u':
                    {
                        int chcode;
                        // 4 hex digits
                        if (currentChar + 3 >= inputText + inputLen)
                        {
                            //no room left for 4 hex chars
                           ThrowSyntaxError(JSERR_JsonNoStrEnd);

                        }
                        if (!Js::NumberUtilities::FHexDigit((WCHAR)ReadNextChar(), &tempHex))
                        {
                           ThrowSyntaxError(JSERR_JsonBadHexDigit);
                        }
                        chcode = tempHex * 0x1000;

                        if (!Js::NumberUtilities::FHexDigit((WCHAR)ReadNextChar(), &tempHex))
                        {
                           ThrowSyntaxError(JSERR_JsonBadHexDigit);
                        }
                        chcode += tempHex * 0x0100;

                        if (!Js::NumberUtilities::FHexDigit((WCHAR)ReadNextChar(), &tempHex))
                        {
                           ThrowSyntaxError(JSERR_JsonBadHexDigit);
                        }
                        chcode += tempHex * 0x0010;

                        if (!Js::NumberUtilities::FHexDigit((WCHAR)ReadNextChar(), &tempHex))
                        {
                           ThrowSyntaxError(JSERR_JsonBadHexDigit);
                        }
                        chcode += tempHex;
                        AssertMsg(chcode == (chcode & 0xFFFF), "Bad unicode code");
                        ch = (char16)chcode;
                    }
                    break;

                default:
                    // Any other '\o' is an error in JSON
                   ThrowSyntaxError(JSERR_JsonIllegalChar);
                }

                // flush
                this->GetCurrentRangeCharacterPairList()->Add(RangeCharacterPair((uint)(bulkStart - inputText), bulkLength, ch));

                uint oldIndex = currentIndex;
                currentIndex += bulkLength;
                currentIndex++;

                if (currentIndex < oldIndex)
                {
                    // Overflow
                    Js::Throw::OutOfMemory();
                }

                // mark the mode as 'string transformed' (no direct mapping in inputText possible)
                isStringDirectInputTextMapped = false;

                // reset (to next char)
                bulkStart = currentChar;
                bulkLength = 0;
            }
            else
            {
                // continue
                bulkLength++;
            }
        }

        if (!endFound)
        {
            // no ending '"' found
           ThrowSyntaxError(JSERR_JsonNoStrEnd);
        }

        if (isStringDirectInputTextMapped == false)
        {
            // If the last bulk is not ended with an escape character, make sure that is
            // not built into the final unescaped string
            bool shouldSkipLastCharacter = false;
            if (bulkLength > 0)
            {
                shouldSkipLastCharacter = true;
                this->GetCurrentRangeCharacterPairList()->Add(RangeCharacterPair((uint)(bulkStart - inputText), bulkLength, _u('\0')));
                uint oldIndex = currentIndex;
                currentIndex += bulkLength;
                if (currentIndex < oldIndex)
                {
                    // Overflow
                    Js::Throw::OutOfMemory();
                }
            }

            this->BuildUnescapedString(shouldSkipLastCharacter);
            this->GetCurrentRangeCharacterPairList()->Clear();
            this->currentString = this->stringBuffer;
        }
        else
        {
            // make currentIndex the length (w/o the \0)
            currentIndex = bulkLength;

            OUTPUT_TRACE_DEBUGONLY(Js::JSONPhase, _u("ScanString(): direct-mapped string as '%.*s'\n"),
                GetCurrentStringLen(), GetCurrentString());
        }

        return (pToken->tk = tkStrCon);
    }